

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

void __thiscall
QList<QStyleOptionGraphicsItem>::resize(QList<QStyleOptionGraphicsItem> *this,qsizetype size)

{
  qsizetype qVar1;
  QArrayDataPointer<QStyleOptionGraphicsItem> *in_RSI;
  QArrayDataPointer<QStyleOptionGraphicsItem> *in_RDI;
  QList<QStyleOptionGraphicsItem> *unaff_retaddr;
  QArrayDataPointer<QStyleOptionGraphicsItem> *this_00;
  
  resize_internal(unaff_retaddr,(qsizetype)in_RDI);
  this_00 = in_RSI;
  qVar1 = QList<QStyleOptionGraphicsItem>::size((QList<QStyleOptionGraphicsItem> *)in_RDI);
  if (qVar1 < (long)in_RSI) {
    QArrayDataPointer<QStyleOptionGraphicsItem>::operator->(in_RDI);
    QArrayDataPointer<QStyleOptionGraphicsItem>::appendInitialize(this_00,(qsizetype)in_RSI);
  }
  return;
}

Assistant:

void resize(qsizetype size)
    {
        resize_internal(size);
        if (size > this->size())
            d->appendInitialize(size);
    }